

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall protozero::MessageFilter::MessageFilter(MessageFilter *this)

{
  MessageFilter *this_local;
  
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)this);
  this->out_ = (uint8_t *)0x0;
  this->out_end_ = (uint8_t *)0x0;
  this->root_msg_index_ = 0;
  FilterBytecodeParser::FilterBytecodeParser(&this->filter_);
  MessageTokenizer::MessageTokenizer(&this->tokenizer_);
  perfetto::std::
  vector<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
  ::vector(&this->stack_);
  this->error_ = false;
  this->track_field_usage_ = false;
  perfetto::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&this->field_usage_);
  perfetto::std::
  vector<protozero::MessageFilter::StackState,_std::allocator<protozero::MessageFilter::StackState>_>
  ::emplace_back<>(&this->stack_);
  return;
}

Assistant:

MessageFilter::MessageFilter() {
  // Push a state on the stack for the implicit root message.
  stack_.emplace_back();
}